

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O0

void __thiscall VulkanUtilities::VulkanCommandBuffer::NextSubpass(VulkanCommandBuffer *this)

{
  Char *pCVar1;
  char (*in_RCX) [32];
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  VulkanCommandBuffer *this_local;
  
  msg.field_2._8_8_ = this;
  if ((this->m_State).RenderPass == (VkRenderPass)0x0) {
    Diligent::FormatString<char[33]>
              ((string *)local_30,(char (*) [33])"Render pass has not been started");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [32])0x160;
    Diligent::DebugAssertionFailed
              (pCVar1,"NextSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x160);
    std::__cxx11::string::~string((string *)local_30);
  }
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              ((string *)local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (pCVar1,"NextSubpass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x161);
    std::__cxx11::string::~string((string *)local_60);
  }
  (*vkCmdNextSubpass)(this->m_VkCmdBuffer,VK_SUBPASS_CONTENTS_INLINE);
  return;
}

Assistant:

__forceinline void NextSubpass()
    {
        VERIFY(m_State.RenderPass != VK_NULL_HANDLE, "Render pass has not been started");
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        vkCmdNextSubpass(m_VkCmdBuffer, VK_SUBPASS_CONTENTS_INLINE);
    }